

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

uint64_t search_one_dual(int *lev0,int *lev1,int nb_strengths,uint64_t (**mse) [64],int sb_count,
                        CDEF_PICK_METHOD pick_method)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  int k;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t tot_mse [64] [64];
  undefined1 local_8038 [32776];
  
  uVar12 = 0x8000000000000000;
  uVar1 = nb_cdef_strengths[pick_method];
  uVar11 = 0;
  memset(local_8038,0,0x8000);
  uVar3 = 0;
  if (0 < nb_strengths) {
    uVar3 = (ulong)(uint)nb_strengths;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  uVar5 = (ulong)(uint)sb_count;
  if (sb_count < 1) {
    uVar5 = uVar11;
  }
  for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    uVar6 = 0x8000000000000000;
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      uVar9 = mse[1][uVar4][lev1[uVar7]] + (*mse)[uVar4][lev0[uVar7]];
      if (uVar9 < uVar6) {
        uVar6 = uVar9;
      }
    }
    puVar8 = local_8038;
    for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        uVar10 = *(long *)((long)*mse[1] + uVar9 * 8 + uVar11) + (*mse)[uVar4][uVar7];
        if (uVar6 <= uVar10) {
          uVar10 = uVar6;
        }
        *(ulong *)(puVar8 + uVar9 * 8) = *(long *)(puVar8 + uVar9 * 8) + uVar10;
      }
      puVar8 = puVar8 + 0x200;
    }
    uVar11 = uVar11 + 0x200;
  }
  puVar8 = local_8038;
  uVar3 = 0;
  uVar5 = 0;
  for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      if (*(ulong *)(puVar8 + uVar4 * 8) < uVar12) {
        uVar3 = uVar11 & 0xffffffff;
        uVar5 = uVar4 & 0xffffffff;
        uVar12 = *(ulong *)(puVar8 + uVar4 * 8);
      }
    }
    puVar8 = puVar8 + 0x200;
  }
  lev0[nb_strengths] = (int)uVar3;
  lev1[nb_strengths] = (int)uVar5;
  return uVar12;
}

Assistant:

static uint64_t search_one_dual(int *lev0, int *lev1, int nb_strengths,
                                uint64_t (**mse)[TOTAL_STRENGTHS], int sb_count,
                                CDEF_PICK_METHOD pick_method) {
  uint64_t tot_mse[TOTAL_STRENGTHS][TOTAL_STRENGTHS];
  int i, j;
  uint64_t best_tot_mse = (uint64_t)1 << 63;
  int best_id0 = 0;
  int best_id1 = 0;
  const int total_strengths = nb_cdef_strengths[pick_method];
  memset(tot_mse, 0, sizeof(tot_mse));
  for (i = 0; i < sb_count; i++) {
    int gi;
    uint64_t best_mse = (uint64_t)1 << 63;
    /* Find best mse among already selected options. */
    for (gi = 0; gi < nb_strengths; gi++) {
      uint64_t curr = mse[0][i][lev0[gi]];
      curr += mse[1][i][lev1[gi]];
      if (curr < best_mse) {
        best_mse = curr;
      }
    }
    /* Find best mse when adding each possible new option. */
    for (j = 0; j < total_strengths; j++) {
      int k;
      for (k = 0; k < total_strengths; k++) {
        uint64_t best = best_mse;
        uint64_t curr = mse[0][i][j];
        curr += mse[1][i][k];
        if (curr < best) best = curr;
        tot_mse[j][k] += best;
      }
    }
  }
  for (j = 0; j < total_strengths; j++) {
    int k;
    for (k = 0; k < total_strengths; k++) {
      if (tot_mse[j][k] < best_tot_mse) {
        best_tot_mse = tot_mse[j][k];
        best_id0 = j;
        best_id1 = k;
      }
    }
  }
  lev0[nb_strengths] = best_id0;
  lev1[nb_strengths] = best_id1;
  return best_tot_mse;
}